

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestCompressionF<Counter<unsigned_int,32u>,Counter<unsigned_char,4u>>(int bias)

{
  Counter<unsigned_char,_4U> local_139;
  Counter<unsigned_int,_32U> local_138;
  Counter<unsigned_int,_32U> local_134;
  Counter<unsigned_char,_4U> local_12d;
  Counter<unsigned_int,_32U> local_12c;
  Counter<unsigned_int,_32U> local_128;
  int local_124;
  Counter<unsigned_int,_32U> expanded;
  int delta_1;
  int delta;
  uint uStack_114;
  Counter<unsigned_char,_4U> truncatedRecent;
  Counter<unsigned_int,_32U> fullRecent;
  uint recent;
  uint uStack_108;
  Counter<unsigned_char,_4U> truncatedOriginal;
  Counter<unsigned_int,_32U> fullOriginal;
  uint original;
  uint range;
  int bias_local;
  Counter<unsigned_int,_32U> local_d8;
  uint local_d4;
  Counter<unsigned_int,_32U> local_d0;
  uint absDiff_1;
  uint local_c8;
  uint absDiff;
  uint recentLow;
  Counter<unsigned_int,_32U> *local_b8;
  Counter<unsigned_int,_32U> *local_b0;
  ThisType *result;
  Counter<unsigned_int,_32U> *local_a0;
  Counter<unsigned_char,_4U> *local_98;
  Counter<unsigned_char,_4U> *local_90;
  Counter<unsigned_char,_4U> *local_88;
  Counter<unsigned_char,_4U> *local_80;
  Counter<unsigned_int,_32U> *local_78;
  Counter<unsigned_int,_32U> *local_70;
  uint *local_68;
  Counter<unsigned_int,_32U> *local_60;
  uint *local_58;
  Counter<unsigned_int,_32U> *local_50;
  int local_44;
  uint local_40;
  SignedType gapSigned;
  ValueType_conflict gapMSB;
  ValueType_conflict2 gap;
  uint uStack_34;
  ValueType_conflict2 smallRecent;
  SignedType smallerSigned;
  ValueType_conflict smallerMSB;
  Counter<unsigned_int,_32U> *local_28;
  Counter<unsigned_int,_32U> *local_20;
  Counter<unsigned_int,_32U> *local_18;
  Counter<unsigned_int,_32U> *local_10;
  
  uStack_108 = 0;
  do {
    if (0x1f < uStack_108) {
      return true;
    }
    Counter<unsigned_int,_32U>::Counter((Counter<unsigned_int,_32U> *)&recent,uStack_108);
    Counter<unsigned_char,_4U>::Counter
              ((Counter<unsigned_char,_4U> *)((long)&fullRecent.Value + 3),'\0');
    Counter<unsigned_char,_4U>::operator=
              ((Counter<unsigned_char,_4U> *)((long)&fullRecent.Value + 3),(uchar)recent);
    for (uStack_114 = 0; uStack_114 < 0x20; uStack_114 = uStack_114 + 1) {
      Counter<unsigned_int,_32U>::Counter((Counter<unsigned_int,_32U> *)&delta,uStack_114);
      Counter<unsigned_char,_4U>::Counter((Counter<unsigned_char,_4U> *)((long)&delta_1 + 3),'\0');
      Counter<unsigned_char,_4U>::operator=
                ((Counter<unsigned_char,_4U> *)((long)&delta_1 + 3),(uchar)delta);
      if (uStack_114 < uStack_108) {
        expanded.Value = uStack_108 - uStack_114;
        if ((int)expanded.Value < 8 - bias) {
LAB_00112ce9:
          Counter<unsigned_int,_32U>::Counter(&local_12c,(ThisType *)&delta);
          Counter<unsigned_char,_4U>::Counter(&local_12d,(ThisType *)((long)&fullRecent.Value + 3));
          local_b0 = &local_128;
          local_b8 = &local_12c;
          _recentLow = &local_12d;
          local_80 = &local_12d;
          local_70 = &local_12c;
          absDiff = bias;
          Counter<unsigned_int,_32U>::Counter
                    (&local_128,(uint)local_12d.Value | local_12c.Value & 0xfffffff0);
          local_78 = &local_12c;
          local_c8 = local_12c.Value & 0xf;
          local_88 = &local_12d;
          if (local_c8 < local_12d.Value) {
            local_90 = &local_12d;
            absDiff_1 = local_12d.Value - local_c8;
            if (8 - absDiff <= absDiff_1) {
              Counter<unsigned_int,_32U>::Counter(&local_d0,0x10);
              local_10 = &local_128;
              local_18 = &local_d0;
              local_128.Value = local_128.Value - local_d0.Value;
            }
          }
          else {
            local_98 = &local_12d;
            local_d4 = local_c8 - local_12d.Value;
            if (absDiff + 8 < local_d4) {
              Counter<unsigned_int,_32U>::Counter(&local_d8,0x10);
              local_a0 = &local_128;
              result = &local_d8;
              local_128.Value = local_128.Value + local_d8.Value;
            }
          }
          local_50 = &local_128;
          local_58 = &recent;
          if (local_128.Value != recent) {
            return false;
          }
          if (bias == 0) {
            Counter<unsigned_int,_32U>::Counter(&local_138,(ThisType *)&delta);
            Counter<unsigned_char,_4U>::Counter
                      (&local_139,(ThisType *)((long)&fullRecent.Value + 3));
            local_20 = &local_134;
            local_28 = &local_138;
            _smallerSigned = &local_139;
            uStack_34 = local_139.Value & 8;
            gapMSB = (uint)local_139.Value + uStack_34 * -2;
            gapSigned._3_1_ = (byte)local_138.Value & 0xf;
            gapSigned._2_1_ = (char)gapMSB - gapSigned._3_1_ & 0xf;
            local_40 = gapSigned._2_1_ & 8;
            local_44 = (uint)gapSigned._2_1_ + local_40 * -2;
            Counter<unsigned_int,_32U>::Counter(&local_134,local_138.Value + local_44);
            Counter<unsigned_int,_32U>::operator=(&local_128,&local_134);
            local_60 = &local_128;
            local_68 = &recent;
            if (local_128.Value != recent) {
              return false;
            }
          }
        }
      }
      else {
        local_124 = uStack_114 - uStack_108;
        if (local_124 <= bias + 8) goto LAB_00112ce9;
      }
    }
    uStack_108 = uStack_108 + 1;
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}